

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenLine(Lexer *this)

{
  bool bVar1;
  Lexer *in_RSI;
  Position local_38;
  undefined2 local_1c;
  char local_19;
  char c;
  Lexer *this_local;
  
  local_19 = (char)in_RSI->currentChar;
  this_local = this;
  nextChar(in_RSI);
  if (((int)local_19 != in_RSI->currentChar) &&
     (bVar1 = _isNewLineCharacter((char)in_RSI->currentChar), bVar1)) {
    nextChar(in_RSI);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&in_RSI->lineIndices,&in_RSI->currentEndIndex);
  local_1c = 1;
  getCurrentCursor(&local_38,in_RSI);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
            ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)&local_1c);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenLine() noexcept {
  char c = currentChar;
  nextChar(); // eat newline char

  // eat again if newline character (but not equal to the previous one)
  if (c != currentChar && _isNewLineCharacter(currentChar))
    nextChar();

  lineIndices.push_back(currentEndIndex);
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOL, getCurrentCursor());
}